

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegMemOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint32_t Imm12;
  uint32_t uVar4;
  DecodeStatus DVar5;
  uint uVar6;
  void *Decoder_00;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint U;
  uint imm;
  uint type;
  uint Rm;
  uint Rn;
  uint shift;
  ARM_AM_ShiftOpc ShOp;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffcc;
  ARM_AM_ShiftOpc local_30;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction_4(in_ESI,0xd,4);
  RegNo = fieldFromInstruction_4(local_14,0,4);
  uVar3 = fieldFromInstruction_4(local_14,5,2);
  Imm12 = fieldFromInstruction_4(local_14,7,5);
  uVar4 = fieldFromInstruction_4(local_14,0xc,1);
  local_30 = ARM_AM_lsl;
  Decoder_00 = (void *)(ulong)uVar3;
  switch(Decoder_00) {
  case (void *)0x0:
    local_30 = ARM_AM_lsl;
    break;
  case (void *)0x1:
    local_30 = ARM_AM_lsr;
    break;
  case (void *)0x2:
    local_30 = ARM_AM_asr;
    break;
  case (void *)0x3:
    local_30 = ARM_AM_ror;
  }
  if ((local_30 == ARM_AM_ror) && (Imm12 == 0)) {
    local_30 = ARM_AM_rrx;
  }
  DVar5 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(in_stack_ffffffffffffffcc,uVar2),RegNo,CONCAT44(Imm12,uVar4)
                     ,Decoder_00);
  _Var1 = Check(local_2c,DVar5);
  if (_Var1) {
    DVar5 = DecodeGPRRegisterClass
                      ((MCInst *)CONCAT44(in_stack_ffffffffffffffcc,uVar2),RegNo,
                       CONCAT44(Imm12,uVar4),Decoder_00);
    _Var1 = Check(local_2c,DVar5);
    if (_Var1) {
      if (uVar4 == 0) {
        uVar6 = ARM_AM_getAM2Opc(ARM_AM_sub,Imm12,local_30,0);
      }
      else {
        uVar6 = ARM_AM_getAM2Opc(ARM_AM_add,Imm12,local_30,0);
      }
      MCOperand_CreateImm0(local_10,(ulong)uVar6);
      local_4 = local_2c[0];
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSORegMemOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc ShOp;
	unsigned shift;
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned Rm = fieldFromInstruction_4(Val,  0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);
	unsigned U = fieldFromInstruction_4(Val, 12, 1);

	ShOp = ARM_AM_lsl;
	switch (type) {
		case 0:
			ShOp = ARM_AM_lsl;
			break;
		case 1:
			ShOp = ARM_AM_lsr;
			break;
		case 2:
			ShOp = ARM_AM_asr;
			break;
		case 3:
			ShOp = ARM_AM_ror;
			break;
	}

	if (ShOp == ARM_AM_ror && imm == 0)
		ShOp = ARM_AM_rrx;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (U)
		shift = ARM_AM_getAM2Opc(ARM_AM_add, imm, ShOp, 0);
	else
		shift = ARM_AM_getAM2Opc(ARM_AM_sub, imm, ShOp, 0);
	MCOperand_CreateImm0(Inst, shift);

	return S;
}